

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O1

integer_t tchecker::refdbm::constrain_to_single_valuation(db_t *rdbm,reference_clock_variables_t *r)

{
  uint uVar1;
  clock_id_t x;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  overflow_error *this;
  ulong uVar5;
  int iVar6;
  int factor;
  clock_id_t x_00;
  ulong uVar7;
  
  if (rdbm == (db_t *)0x0) {
    __assert_fail("rdbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3bd,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar3 = is_consistent(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3be,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar3 = is_tight(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3bf,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  uVar2 = *(stored_size_type *)
           ((long)&(r->super_flat_clock_variables_t).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (uVar2 != *(stored_size_type *)
                ((long)&(r->super_flat_clock_variables_t).
                        super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._index._value_map.m_flat_tree.m_data + 8)) {
    __assert_fail("_key_map.size() == _value_map.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/index.hh"
                  ,0x90,
                  "size_t tchecker::index_t<unsigned int, std::basic_string<char>>::size() const [KEY = unsigned int, T = std::basic_string<char>]"
                 );
  }
  factor = 1;
  if (1 < (uint)uVar2) {
    uVar1 = r->_refcount;
    uVar7 = 1;
    uVar5 = uVar2;
    do {
      x_00 = (clock_id_t)uVar7;
      bVar3 = has_fixed_value(rdbm,r,x_00);
      if (!bVar3) {
        bVar3 = admits_integer_value(rdbm,r,x_00);
        if (!bVar3) {
          if (0x3fffffff < factor) {
            this = (overflow_error *)__cxa_allocate_exception(0x10);
            std::overflow_error::overflow_error
                      (this,"tchecker::refdbm::constrain_to_single_valuation: scale factor overflow"
                      );
            goto LAB_0014f380;
          }
          factor = factor * 2;
          scale_up(rdbm,r,factor);
        }
        if (uVar7 < uVar1) {
          iVar4 = ((uint)rdbm[uVar5 & 0xffffffff] & 1) + ((int)rdbm[uVar5 & 0xffffffff] >> 1) + -1;
          iVar6 = (~(uint)rdbm[uVar7] & 1) - ((int)rdbm[uVar7] >> 1);
          if (iVar4 < iVar6) {
            __assert_fail("-max_v_0x <= max_v_x0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                          ,0x3dc,
                          "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                         );
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          if (iVar4 < 0) {
            iVar6 = iVar4;
          }
          constrain(rdbm,r,x_00,0,LE,iVar6);
          constrain(rdbm,r,0,x_00,LE,-iVar6);
        }
        else {
          x = (r->_refmap).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
          iVar6 = (int)rdbm[x * (uint)uVar2 + x_00] >> 1;
          if (iVar6 < -0x3fffffff) {
            this = (overflow_error *)__cxa_allocate_exception(0x10);
            std::overflow_error::overflow_error
                      (this,
                       "tchecker::refdbm::constrain_to_single_valuation: integer value overflow");
LAB_0014f380:
            __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
          }
          iVar6 = (~(uint)rdbm[x * (uint)uVar2 + x_00] & 1) - iVar6;
          constrain(rdbm,r,x,x_00,LE,-iVar6);
          constrain(rdbm,r,x_00,x,LE,iVar6);
        }
      }
      uVar7 = uVar7 + 1;
      uVar5 = uVar5 + uVar2;
    } while ((uVar2 & 0xffffffff) != uVar7);
  }
  bVar3 = is_consistent(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3f4,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar3 = is_tight(rdbm,r);
  if (!bVar3) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x3f5,
                  "tchecker::integer_t tchecker::refdbm::constrain_to_single_valuation(tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  return factor;
}

Assistant:

tchecker::integer_t constrain_to_single_valuation(tchecker::dbm::db_t * rdbm, tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  tchecker::integer_t factor = 1;

  tchecker::clock_id_t const rdim = r.size();
  tchecker::clock_id_t const refcount = r.refcount();
  std::vector<tchecker::clock_id_t> const & refmap = r.refmap();
  for (tchecker::clock_id_t x = 1; x < rdim; ++x) {
    // find clock which has not fixed value yet
    if (tchecker::refdbm::has_fixed_value(rdbm, r, x))
      continue;

    // if selected clock does not admit integer value, scale dbm up
    if (!tchecker::refdbm::admits_integer_value(rdbm, r, x)) {
      if (factor > std::numeric_limits<tchecker::integer_t>::max() / 2)
        throw std::overflow_error("tchecker::refdbm::constrain_to_single_valuation: scale factor overflow");
      factor *= 2;
      tchecker::refdbm::scale_up(rdbm, r, factor);
    }

    // if x is a reference clock, then choose integer value w.r.t. first reference clock (i.e. 0)
    if (x < refcount) {
      // x-0<vx0 && 0-x<v0x
      // <=> -v0x < x-0 < vx0
      // then, choose smallest absolute value v within [-v0x,vx0], and set x-0 == v
      tchecker::integer_t const max_v_x0 =
          tchecker::dbm::value(RDBM(x, 0)) - (tchecker::dbm::comparator(RDBM(x, 0)) == tchecker::LE ? 0 : 1);
      tchecker::integer_t const max_v_0x =
          tchecker::dbm::value(RDBM(0, x)) - (tchecker::dbm::comparator(RDBM(0, x)) == tchecker::LE ? 0 : 1);
      assert(-max_v_0x <= max_v_x0);
      // choose smallest absolute value v between -max_v_0x and max_v_x0
      tchecker::integer_t v = 0;
      if (max_v_x0 < 0)
        v = max_v_x0;
      else if (-max_v_0x > 0)
        v = -max_v_0x;
      tchecker::refdbm::constrain(rdbm, r, x, 0, tchecker::LE, v);
      tchecker::refdbm::constrain(rdbm, r, 0, x, tchecker::LE, -v);
    }
    else {
      // otherwise, choose integer value w.r.t. reference clock (using rx<=x)
      tchecker::clock_id_t const rx = refmap[x];

      if (tchecker::dbm::value(RDBM(rx, x)) <= tchecker::dbm::MIN_VALUE)
        throw std::overflow_error("tchecker::refdbm::constrain_to_single_valuation: integer value overflow");

      tchecker::integer_t v =
          -tchecker::dbm::value(RDBM(rx, x)) + (tchecker::dbm::comparator(RDBM(rx, x)) == tchecker::LE ? 0 : 1);
      tchecker::refdbm::constrain(rdbm, r, rx, x, tchecker::LE, -v);
      tchecker::refdbm::constrain(rdbm, r, x, rx, tchecker::LE, v);
    }
  }

  assert(tchecker::refdbm::is_consistent(rdbm, r));
  assert(tchecker::refdbm::is_tight(rdbm, r));

  return factor;
}